

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

aiMesh * __thiscall Assimp::IFC::TempMesh::ToMesh(TempMesh *this)

{
  bool bVar1;
  size_type sVar2;
  iterator __first;
  unsigned_long uVar3;
  aiMesh *this_00;
  pointer paVar4;
  ulong uVar5;
  aiVector3D *paVar6;
  iterator __first_00;
  iterator __last;
  ulong *puVar7;
  reference pvVar8;
  uint *puVar9;
  aiFace *paVar10;
  aiFace *local_f8;
  aiVector3t<float> *local_b0;
  uint local_6c;
  uint a;
  aiFace *f;
  uint local_58;
  uint acc;
  uint n;
  uint i;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> local_30;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  TempMesh *this_local;
  
  sVar2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size(&this->mVerts)
  ;
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->mVertcnt);
  mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->mVertcnt);
  uVar3 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                    ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )__first._M_current,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                       super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl,0);
  if (sVar2 == uVar3) {
    bVar1 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::empty
                      (&this->mVerts);
    if (bVar1) {
      this_local = (TempMesh *)0x0;
    }
    else {
      this_00 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_00);
      std::unique_ptr<aiMesh,std::default_delete<aiMesh>>::
      unique_ptr<std::default_delete<aiMesh>,void>
                ((unique_ptr<aiMesh,std::default_delete<aiMesh>> *)&local_30,this_00);
      sVar2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                        (&this->mVerts);
      paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_30);
      paVar4->mNumVertices = (uint)sVar2;
      paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_30);
      uVar5 = (ulong)paVar4->mNumVertices;
      paVar6 = (aiVector3D *)operator_new__(uVar5 * 0xc);
      if (uVar5 != 0) {
        local_b0 = paVar6;
        do {
          aiVector3t<float>::aiVector3t(local_b0);
          local_b0 = local_b0 + 1;
        } while (local_b0 != paVar6 + uVar5);
      }
      paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_30);
      paVar4->mVertices = paVar6;
      __first_00 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                             (&this->mVerts);
      __last = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                         (&this->mVerts);
      paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_30);
      std::
      copy<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,aiVector3t<float>*>
                ((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  )__first_00._M_current,
                 (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  )__last._M_current,paVar4->mVertices);
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->mVertcnt);
      paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_30);
      paVar4->mNumFaces = (uint)sVar2;
      paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_30);
      uVar5 = (ulong)paVar4->mNumFaces;
      puVar7 = (ulong *)operator_new__(uVar5 << 4 | 8);
      *puVar7 = uVar5;
      paVar10 = (aiFace *)(puVar7 + 1);
      if (uVar5 != 0) {
        local_f8 = paVar10;
        do {
          aiFace::aiFace(local_f8);
          local_f8 = local_f8 + 1;
        } while (local_f8 != paVar10 + uVar5);
      }
      paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_30);
      paVar4->mFaces = paVar10;
      acc = 0;
      local_58 = 0;
      f._4_4_ = 0;
      while( true ) {
        paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_30);
        if (paVar4->mNumFaces <= acc) break;
        paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_30);
        paVar10 = paVar4->mFaces + acc;
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->mVertcnt,(ulong)local_58);
        if (*pvVar8 == 0) {
          paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_30);
          paVar4->mNumFaces = paVar4->mNumFaces - 1;
        }
        else {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->mVertcnt,(ulong)local_58);
          paVar10->mNumIndices = *pvVar8;
          puVar9 = (uint *)operator_new__((ulong)paVar10->mNumIndices << 2);
          paVar10->mIndices = puVar9;
          for (local_6c = 0; local_6c < paVar10->mNumIndices; local_6c = local_6c + 1) {
            paVar10->mIndices[local_6c] = f._4_4_;
            f._4_4_ = f._4_4_ + 1;
          }
          acc = acc + 1;
        }
        local_58 = local_58 + 1;
      }
      this_local = (TempMesh *)
                   std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::release(&local_30);
      std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(&local_30);
    }
    return (aiMesh *)this_local;
  }
  __assert_fail("mVerts.size() == std::accumulate(mVertcnt.begin(),mVertcnt.end(),size_t(0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCUtil.cpp"
                ,0x47,"aiMesh *Assimp::IFC::TempMesh::ToMesh()");
}

Assistant:

aiMesh* TempMesh::ToMesh()
{
    ai_assert(mVerts.size() == std::accumulate(mVertcnt.begin(),mVertcnt.end(),size_t(0)));

    if (mVerts.empty()) {
        return NULL;
    }

    std::unique_ptr<aiMesh> mesh(new aiMesh());

    // copy vertices
    mesh->mNumVertices = static_cast<unsigned int>(mVerts.size());
    mesh->mVertices = new aiVector3D[mesh->mNumVertices];
    std::copy(mVerts.begin(),mVerts.end(),mesh->mVertices);

    // and build up faces
    mesh->mNumFaces = static_cast<unsigned int>(mVertcnt.size());
    mesh->mFaces = new aiFace[mesh->mNumFaces];

    for(unsigned int i = 0,n=0, acc = 0; i < mesh->mNumFaces; ++n) {
        aiFace& f = mesh->mFaces[i];
        if (!mVertcnt[n]) {
            --mesh->mNumFaces;
            continue;
        }

        f.mNumIndices = mVertcnt[n];
        f.mIndices = new unsigned int[f.mNumIndices];
        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            f.mIndices[a] = acc++;
        }

        ++i;
    }

    return mesh.release();
}